

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall TPZFMatrix<long_double>::~TPZFMatrix(TPZFMatrix<long_double> *this,void **vtt)

{
  longdouble *plVar1;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  plVar1 = this->fElem;
  if ((plVar1 != (longdouble *)0x0) && (plVar1 != this->fGiven)) {
    operator_delete__(plVar1);
  }
  this->fElem = (longdouble *)0x0;
  this->fSize = 0;
  TPZVec<long_double>::~TPZVec(&this->fWork);
  TPZManVector<int,_5>::~TPZManVector(&this->fPivot);
  return;
}

Assistant:

TPZFMatrix<TVar>::~TPZFMatrix() {
    if(fElem && fElem != fGiven) delete[]( fElem );
    fElem = 0;
    fSize = 0;
}